

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

void __thiscall
miniros::Subscription::Subscription
          (Subscription *this,string *name,string *md5sum,string *datatype,
          TransportHints *transport_hints)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  StatisticsLogger *this_00;
  TransportHints *pTVar1;
  
  std::enable_shared_from_this<miniros::Subscription>::enable_shared_from_this
            ((enable_shared_from_this<miniros::Subscription> *)0x4cf4d0);
  *in_RDI = &PTR__Subscription_0061fb10;
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RSI);
  std::mutex::mutex((mutex *)0x4cf506);
  std::__cxx11::string::string((string *)(in_RDI + 0xc),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 0x10),in_RCX);
  std::mutex::mutex((mutex *)0x4cf54b);
  std::
  vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ::vector((vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
            *)0x4cf560);
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined1 *)((long)in_RDI + 0xe4) = 0;
  *(undefined1 *)((long)in_RDI + 0xe5) = 0;
  std::mutex::mutex((mutex *)0x4cf589);
  this_00 = (StatisticsLogger *)(in_RDI + 0x22);
  std::
  set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::set((set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
         *)0x4cf59f);
  std::mutex::mutex((mutex *)0x4cf5b0);
  pTVar1 = (TransportHints *)(in_RDI + 0x2d);
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::vector((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
            *)0x4cf5c6);
  std::mutex::mutex((mutex *)0x4cf5d7);
  TransportHints::TransportHints((TransportHints *)(in_RDI + 0x35),pTVar1);
  StatisticsLogger::StatisticsLogger(this_00);
  std::
  map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
  ::map((map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
         *)0x4cf618);
  std::
  vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
  ::vector((vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
            *)0x4cf629);
  return;
}

Assistant:

Subscription::Subscription(const std::string &name, const std::string& md5sum, const std::string& datatype, const TransportHints& transport_hints)
: name_(name)
, md5sum_(md5sum)
, datatype_(datatype)
, nonconst_callbacks_(0)
, dropped_(false)
, shutting_down_(false)
, transport_hints_(transport_hints)
{
}